

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void not_equal_to_suite::compare_null_with_integer(void)

{
  bool bVar1;
  basic_variable<std::allocator<char>_> local_1c8;
  basic_variable<std::allocator<char>_> local_198;
  not_equal_to<trial::dynamic::basic_variable<std::allocator<char>_>_> local_159;
  basic_variable<std::allocator<char>_> local_158;
  basic_variable<std::allocator<char>_> local_128;
  not_equal_to<trial::dynamic::basic_variable<std::allocator<char>_>_> local_e9;
  basic_variable<std::allocator<char>_> local_e8;
  basic_variable<std::allocator<char>_> local_b8;
  not_equal_to<trial::dynamic::basic_variable<std::allocator<char>_>_> local_85 [13];
  basic_variable<std::allocator<char>_> local_78;
  basic_variable<std::allocator<char>_> local_48;
  not_equal_to<trial::dynamic::basic_variable<std::allocator<char>_>_> local_9;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_78,2);
  bVar1 = std::not_equal_to<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator()
                    (&local_9,&local_48,&local_78);
  boost::detail::test_impl
            ("std::not_equal_to<variable>()(variable(), variable(2))",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x21ac,"void not_equal_to_suite::compare_null_with_integer()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_e8,2);
  bVar1 = std::not_equal_to<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator()
                    (local_85,&local_b8,&local_e8);
  boost::detail::test_impl
            ("std::not_equal_to<variable>()(variable(), variable(2U))",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x21ad,"void not_equal_to_suite::compare_null_with_integer()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_128);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_158,2);
  bVar1 = std::not_equal_to<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator()
                    (&local_e9,&local_128,&local_158);
  boost::detail::test_impl
            ("std::not_equal_to<variable>()(variable(), 2)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x21af,"void not_equal_to_suite::compare_null_with_integer()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_128);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_1c8,2);
  bVar1 = std::not_equal_to<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator()
                    (&local_159,&local_198,&local_1c8);
  boost::detail::test_impl
            ("std::not_equal_to<variable>()(variable(), 2U)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x21b0,"void not_equal_to_suite::compare_null_with_integer()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_198);
  return;
}

Assistant:

void compare_null_with_integer()
{
    TRIAL_PROTOCOL_TEST(std::not_equal_to<variable>()(variable(), variable(2)));
    TRIAL_PROTOCOL_TEST(std::not_equal_to<variable>()(variable(), variable(2U)));

    TRIAL_PROTOCOL_TEST(std::not_equal_to<variable>()(variable(), 2));
    TRIAL_PROTOCOL_TEST(std::not_equal_to<variable>()(variable(), 2U));
}